

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O0

void __thiscall
FS::Focuser::Focuser
          (Focuser *this,unique_ptr<NetInterface,_std::default_delete<NetInterface>_> *netArg,
          unique_ptr<HWI,_std::default_delete<HWI>_> *hardwareArg,
          unique_ptr<DebugInterface,_std::default_delete<DebugInterface>_> *debugArg,
          BuildParams params)

{
  type sink;
  pointer pNVar1;
  pointer serialDebugArg;
  pointer pHVar2;
  unique_ptr<DebugInterface,_std::default_delete<DebugInterface>_> *this_00;
  undefined1 local_58 [8];
  WifiDebugOstream log;
  DebugInterface *dlog;
  unique_ptr<DebugInterface,_std::default_delete<DebugInterface>_> *debugArg_local;
  unique_ptr<HWI,_std::default_delete<HWI>_> *hardwareArg_local;
  unique_ptr<NetInterface,_std::default_delete<NetInterface>_> *netArg_local;
  Focuser *this_local;
  
  StateStack::StateStack(&this->stateStack);
  std::unique_ptr<NetInterface,std::default_delete<NetInterface>>::
  unique_ptr<std::default_delete<NetInterface>,void>
            ((unique_ptr<NetInterface,std::default_delete<NetInterface>> *)&this->net);
  std::unique_ptr<HWI,std::default_delete<HWI>>::unique_ptr<std::default_delete<HWI>,void>
            ((unique_ptr<HWI,std::default_delete<HWI>> *)&this->hardware);
  this_00 = &this->debugLog;
  std::unique_ptr<DebugInterface,std::default_delete<DebugInterface>>::
  unique_ptr<std::default_delete<DebugInterface>,void>
            ((unique_ptr<DebugInterface,std::default_delete<DebugInterface>> *)this_00);
  (this->buildParams).timingParams.msToPowerStepper = params.timingParams.msToPowerStepper;
  (this->buildParams).timingParams.microSecondStepPause = params.timingParams.microSecondStepPause;
  (this->buildParams).focuserHasHome = params.focuserHasHome;
  *(undefined3 *)&(this->buildParams).field_0x19 = params._25_3_;
  (this->buildParams).maxAbsPos = params.maxAbsPos;
  (this->buildParams).timingParams.msEpochBetweenCommandChecks =
       params.timingParams.msEpochBetweenCommandChecks;
  (this->buildParams).timingParams.maxStepsBetweenChecks = params.timingParams.maxStepsBetweenChecks
  ;
  (this->buildParams).timingParams.msInactivityToSleep = params.timingParams.msInactivityToSleep;
  (this->buildParams).timingParams.msEpochForSleepCommandChecks =
       params.timingParams.msEpochForSleepCommandChecks;
  this->focuserPosition = 0;
  this->isSynched = false;
  this->time = 0;
  this->uSecRemainder = 0;
  this->timeLastInterruptingCommandOccured = 0;
  this->motorState = OFF;
  std::swap<NetInterface,std::default_delete<NetInterface>>(&this->net,netArg);
  std::swap<HWI,std::default_delete<HWI>>(&this->hardware,hardwareArg);
  std::swap<DebugInterface,std::default_delete<DebugInterface>>(this_00,debugArg);
  sink = std::unique_ptr<DebugInterface,_std::default_delete<DebugInterface>_>::operator*(this_00);
  ::operator<<(sink,"Bringing up net interface\n");
  pNVar1 = std::unique_ptr<NetInterface,_std::default_delete<NetInterface>_>::operator->(&this->net)
  ;
  (*pNVar1->_vptr_NetInterface[2])(pNVar1,sink);
  serialDebugArg =
       std::unique_ptr<DebugInterface,_std::default_delete<DebugInterface>_>::get(&this->debugLog);
  pNVar1 = std::unique_ptr<NetInterface,_std::default_delete<NetInterface>_>::get(&this->net);
  WifiDebugOstream::WifiDebugOstream((WifiDebugOstream *)local_58,serialDebugArg,pNVar1);
  pHVar2 = std::unique_ptr<HWI,_std::default_delete<HWI>_>::operator->(&this->hardware);
  (*pHVar2->_vptr_HWI[3])(pHVar2,0);
  pHVar2 = std::unique_ptr<HWI,_std::default_delete<HWI>_>::operator->(&this->hardware);
  (*pHVar2->_vptr_HWI[3])(pHVar2,1,0);
  pHVar2 = std::unique_ptr<HWI,_std::default_delete<HWI>_>::operator->(&this->hardware);
  (*pHVar2->_vptr_HWI[3])(pHVar2,2,0);
  pHVar2 = std::unique_ptr<HWI,_std::default_delete<HWI>_>::operator->(&this->hardware);
  (*pHVar2->_vptr_HWI[3])(pHVar2,3,1);
  setMotor(this,(WifiDebugOstream *)local_58,ON);
  this->dir = FORWARD;
  pHVar2 = std::unique_ptr<HWI,_std::default_delete<HWI>_>::operator->(&this->hardware);
  (*pHVar2->_vptr_HWI[2])(pHVar2,1,2);
  pHVar2 = std::unique_ptr<HWI,_std::default_delete<HWI>_>::operator->(&this->hardware);
  (*pHVar2->_vptr_HWI[2])(pHVar2,0,1);
  ::operator<<((WifiDebugOstream *)local_58,"Focuser is up\n");
  return;
}

Assistant:

Focuser::Focuser(
    std::unique_ptr<NetInterface> netArg,
    std::unique_ptr<HWI> hardwareArg,
    std::unique_ptr<DebugInterface> debugArg,
    const BuildParams params
) : buildParams{ params }
{
  focuserPosition = 0;
  isSynched = false;
  time = 0;
  uSecRemainder = 0;
  timeLastInterruptingCommandOccured = 0;
  motorState = MotorState::OFF;

  std::swap( net, netArg );
  std::swap( hardware, hardwareArg );
  std::swap( debugLog, debugArg );
  
  DebugInterface& dlog = *debugLog;
  dlog << "Bringing up net interface\n";
  
  // Bring up the interface to the controlling computer

  net->setup( dlog );
  WifiDebugOstream log( debugLog.get(), net.get() );

  //
  // Set the pin modes 
  //
  hardware->PinMode(HWI::Pin::STEP,       HWI::PinIOMode::M_OUTPUT );  
  hardware->PinMode(HWI::Pin::DIR,        HWI::PinIOMode::M_OUTPUT );  
  hardware->PinMode(HWI::Pin::MOTOR_ENA,  HWI::PinIOMode::M_OUTPUT );  
  hardware->PinMode(HWI::Pin::HOME,       HWI::PinIOMode::M_INPUT ); 
 
  //
  // Set the output pin defaults and internal state
  // 
  setMotor( log, MotorState::ON ); 

  dir = Dir::FORWARD;
  hardware->DigitalWrite( HWI::Pin::DIR, HWI::PinState::DIR_FORWARD); 
  hardware->DigitalWrite( HWI::Pin::STEP, HWI::PinState::STEP_INACTIVE );

  log << "Focuser is up\n";
}